

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O0

bool __thiscall BamTools::SplitTool::SplitToolPrivate::SplitReference(SplitToolPrivate *this)

{
  bool bVar1;
  reference pvVar2;
  BamWriter *pBVar3;
  reference ppVar4;
  long *in_RDI;
  pair<int,_BamTools::BamWriter_*> pVar5;
  __enable_if_t<is_constructible<value_type,_pair<int,_BamWriter_*>_>::value,_pair<iterator,_bool>_>
  _Var6;
  string outputFilename;
  string refName;
  int32_t currentRefId;
  BamWriter *writer;
  BamAlignment al;
  size_t dotFound;
  string refPrefix;
  iterator writerIter;
  map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  outputFiles;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  _Rb_tree_iterator<std::pair<const_int,_BamTools::BamWriter_*>_> in_stack_fffffffffffffcb0;
  RuleToken *in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  int in_stack_fffffffffffffcc4;
  ostream *in_stack_fffffffffffffcc8;
  SplitToolPrivate *in_stack_fffffffffffffcd0;
  RuleToken *in_stack_fffffffffffffcd8;
  BamAlignment *in_stack_fffffffffffffcf0;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  _Self local_240;
  _Base_ptr local_238;
  int local_22c;
  BamWriter *local_228;
  int local_178;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [32];
  long local_80;
  string local_68 [32];
  _Rb_tree_iterator<std::pair<const_int,_BamTools::BamWriter_*>_> local_48 [8];
  byte local_1;
  
  std::
  map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  ::map((map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
         *)0x23e959);
  std::_Rb_tree_iterator<std::pair<const_int,_BamTools::BamWriter_*>_>::_Rb_tree_iterator(local_48);
  std::__cxx11::string::string(local_68,(string *)SPLIT_REFERENCE_TOKEN_abi_cxx11_);
  if ((*(byte *)(*in_RDI + 2) & 1) != 0) {
    std::__cxx11::string::operator=(local_68,(string *)(*in_RDI + 0x30));
  }
  local_80 = std::__cxx11::string::find((char)local_68,0x2e);
  if (local_80 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,1,'.',&local_c1);
    std::operator+(in_stack_fffffffffffffcb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcb0._M_node);
    std::__cxx11::string::operator=(local_68,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  BamAlignment::BamAlignment(in_stack_fffffffffffffcf0);
  while (bVar1 = BamReader::GetNextAlignment
                           ((BamReader *)in_stack_fffffffffffffcb0._M_node,
                            (BamAlignment *)
                            CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8)), bVar1) {
    local_22c = local_178;
    local_238 = (_Base_ptr)
                std::
                map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                ::find((map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                       (key_type_conflict *)0x23eb39);
    local_48[0]._M_node = local_238;
    local_240._M_node =
         (_Base_ptr)
         std::
         map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
         ::end((map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    bVar1 = std::operator==(local_48,&local_240);
    if (bVar1) {
      std::__cxx11::string::string(local_260);
      if (local_22c == -1) {
        std::__cxx11::string::operator=(local_260,"unmapped");
      }
      else {
        pvVar2 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                           ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)
                            in_stack_fffffffffffffcb0._M_node,
                            CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        std::__cxx11::string::operator=(local_260,(string *)pvVar2);
      }
      std::operator+(in_stack_fffffffffffffcd8,(RuleToken *)in_stack_fffffffffffffcd0);
      std::operator+(in_stack_fffffffffffffcb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcb0._M_node);
      std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0._M_node);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_2c0);
      pBVar3 = (BamWriter *)operator_new(8);
      BamWriter::BamWriter
                ((BamWriter *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      local_228 = pBVar3;
      bVar1 = BamWriter::Open((BamWriter *)
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                              (string *)in_stack_fffffffffffffcb8,
                              (string *)in_stack_fffffffffffffcb0._M_node,
                              (RefVector *)
                              CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
      if (bVar1) {
        pVar5 = std::make_pair<int&,BamTools::BamWriter*&>
                          ((int *)in_stack_fffffffffffffcb0._M_node,
                           (BamWriter **)
                           CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
        in_stack_fffffffffffffcb8 = (RuleToken *)pVar5.second;
        in_stack_fffffffffffffcc4 = pVar5.first;
        _Var6 = std::
                map<int,BamTools::BamWriter*,std::less<int>,std::allocator<std::pair<int_const,BamTools::BamWriter*>>>
                ::insert<std::pair<int,BamTools::BamWriter*>>
                          ((map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                           (pair<int,_BamTools::BamWriter_*> *)in_stack_fffffffffffffcb8);
        in_stack_fffffffffffffcb0 = _Var6.first._M_node;
        in_stack_fffffffffffffcaf = _Var6.second;
      }
      else {
        in_stack_fffffffffffffcd8 =
             (RuleToken *)
             std::operator<<((ostream *)&std::cerr,"bamtools split ERROR: could not open ");
        in_stack_fffffffffffffcd0 =
             (SplitToolPrivate *)std::operator<<((ostream *)in_stack_fffffffffffffcd8,local_280);
        in_stack_fffffffffffffcc8 =
             std::operator<<((ostream *)in_stack_fffffffffffffcd0," for writing.");
        std::ostream::operator<<(in_stack_fffffffffffffcc8,std::endl<char,std::char_traits<char>>);
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_260);
      if (!bVar1) goto LAB_0023ef23;
    }
    else {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_BamTools::BamWriter_*>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_BamTools::BamWriter_*>_> *)
                          0x23eec7);
      local_228 = ppVar4->second;
    }
    if (local_228 != (BamWriter *)0x0) {
      BamWriter::SaveAlignment
                ((BamWriter *)in_stack_fffffffffffffcb0._M_node,
                 (BamAlignment *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
    }
  }
  CloseWriters<int>(in_stack_fffffffffffffcd0,
                    (map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
                     *)in_stack_fffffffffffffcc8);
  local_1 = 1;
LAB_0023ef23:
  BamAlignment::~BamAlignment((BamAlignment *)in_stack_fffffffffffffcb0._M_node);
  std::__cxx11::string::~string(local_68);
  std::
  map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
  ::~map((map<int,_BamTools::BamWriter_*,_std::less<int>,_std::allocator<std::pair<const_int,_BamTools::BamWriter_*>_>_>
          *)0x23ef4a);
  return (bool)(local_1 & 1);
}

Assistant:

bool SplitTool::SplitToolPrivate::SplitReference()
{

    // set up splitting data structure
    std::map<int32_t, BamWriter*> outputFiles;
    std::map<int32_t, BamWriter*>::iterator writerIter;

    // determine reference prefix
    std::string refPrefix = SPLIT_REFERENCE_TOKEN;
    if (m_settings->HasCustomRefPrefix) refPrefix = m_settings->CustomRefPrefix;

    // make sure prefix starts with '.'
    const std::size_t dotFound = refPrefix.find('.');
    if (dotFound != 0) refPrefix = std::string(1, '.') + refPrefix;

    // iterate through alignments
    BamAlignment al;
    BamWriter* writer;
    int32_t currentRefId;
    while (m_reader.GetNextAlignment(al)) {

        // see if bool value exists
        currentRefId = al.RefID;
        writerIter = outputFiles.find(currentRefId);

        // if no writer associated with this value
        if (writerIter == outputFiles.end()) {

            // fetch reference name for ID
            std::string refName;
            if (currentRefId == -1)
                refName = "unmapped";
            else
                refName = m_references.at(currentRefId).RefName;

            // construct new output filename
            const std::string outputFilename = m_outputFilenameStub + refPrefix + refName + ".bam";

            // open new BamWriter
            writer = new BamWriter;
            if (!writer->Open(outputFilename, m_header, m_references)) {
                std::cerr << "bamtools split ERROR: could not open " << outputFilename
                          << " for writing." << std::endl;
                return false;
            }

            // store in map
            outputFiles.insert(std::make_pair(currentRefId, writer));
        }

        // else grab corresponding writer
        else
            writer = (*writerIter).second;

        // store alignment in proper BAM output file
        if (writer) writer->SaveAlignment(al);
    }

    // clean up BamWriters
    CloseWriters(outputFiles);

    // return success
    return true;
}